

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,color4f *value)

{
  bool bVar1;
  float4 v;
  array<float,_4UL> local_18;
  
  bVar1 = ParseBasicTypeTuple<float,4ul>(this,&local_18);
  if (bVar1) {
    value->r = local_18._M_elems[0];
    value->g = local_18._M_elems[1];
    value->b = local_18._M_elems[2];
    value->a = local_18._M_elems[3];
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::color4f *value) {
  value::float4 v;
  if (ParseBasicTypeTuple(&v)) {
    value->r = v[0];
    value->g = v[1];
    value->b = v[2];
    value->a = v[3];
    return true;
  }
  return false;
}